

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O3

int run_test_pipe_overlong_path(void)

{
  int iVar1;
  undefined8 uVar2;
  long *plVar3;
  code **ppcVar4;
  int64_t eval_b_1;
  int64_t eval_b_2;
  uv_connect_t req;
  uv_pipe_t pipe;
  char path [512];
  code *pcStack_370;
  long local_368;
  long local_360;
  long local_358 [13];
  undefined1 local_2f0 [232];
  long local_208 [64];
  
  plVar3 = &local_368;
  pcStack_370 = (code *)0x1b07ea;
  uVar2 = uv_default_loop();
  pcStack_370 = (code *)0x1b07f9;
  iVar1 = uv_pipe_init(uVar2,local_2f0,0);
  local_208[0] = (long)iVar1;
  local_358[0] = 0;
  if (local_208[0] == 0) {
    pcStack_370 = (code *)0x1b0839;
    memset(local_208,0x40,0x200);
    local_358[0] = -0x24;
    pcStack_370 = (code *)0x1b0859;
    iVar1 = uv_pipe_bind2(local_2f0,local_208,0x200,1);
    local_368 = (long)iVar1;
    if (local_358[0] != local_368) goto LAB_001b0a0d;
    local_368 = -0x24;
    pcStack_370 = (code *)0x1b089f;
    iVar1 = uv_pipe_connect2(local_358,local_2f0,local_208,0x200,1,abort);
    local_360 = (long)iVar1;
    if (local_368 != local_360) goto LAB_001b0a1a;
    pcStack_370 = (code *)0x1b08ba;
    uVar2 = uv_default_loop();
    pcStack_370 = (code *)0x1b08c4;
    iVar1 = uv_run(uVar2,0);
    local_368 = (long)iVar1;
    local_360 = 0;
    if (local_368 != 0) goto LAB_001b0a27;
    local_368 = -0x16;
    pcStack_370 = (code *)0x1b08fb;
    iVar1 = uv_pipe_bind(local_2f0,"");
    local_360 = (long)iVar1;
    if (local_368 != local_360) goto LAB_001b0a34;
    pcStack_370 = (code *)0x1b092e;
    uv_pipe_connect(local_358,local_2f0,"",connect_overlong_cb);
    pcStack_370 = (code *)0x1b0933;
    uVar2 = uv_default_loop();
    pcStack_370 = (code *)0x1b093d;
    iVar1 = uv_run(uVar2,0);
    local_368 = (long)iVar1;
    local_360 = 0;
    if (local_368 != 0) goto LAB_001b0a41;
    local_368 = 1;
    local_360 = (long)connect_cb_called;
    if (local_360 != 1) goto LAB_001b0a4e;
    local_368 = 1;
    local_360 = (long)close_cb_called;
    if (local_360 == 1) {
      pcStack_370 = (code *)0x1b09a6;
      uVar2 = uv_default_loop();
      pcStack_370 = (code *)0x1b09ba;
      uv_walk(uVar2,close_walk_cb,0);
      pcStack_370 = (code *)0x1b09c4;
      uv_run(uVar2,0);
      local_368 = 0;
      pcStack_370 = (code *)0x1b09d1;
      uVar2 = uv_default_loop();
      pcStack_370 = (code *)0x1b09d9;
      iVar1 = uv_loop_close(uVar2);
      local_360 = (long)iVar1;
      if (local_368 == local_360) {
        pcStack_370 = (code *)0x1b09f0;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b0a68;
    }
  }
  else {
    pcStack_370 = (code *)0x1b0a0d;
    run_test_pipe_overlong_path_cold_1();
LAB_001b0a0d:
    pcStack_370 = (code *)0x1b0a1a;
    run_test_pipe_overlong_path_cold_2();
LAB_001b0a1a:
    pcStack_370 = (code *)0x1b0a27;
    run_test_pipe_overlong_path_cold_3();
LAB_001b0a27:
    pcStack_370 = (code *)0x1b0a34;
    run_test_pipe_overlong_path_cold_4();
LAB_001b0a34:
    pcStack_370 = (code *)0x1b0a41;
    run_test_pipe_overlong_path_cold_5();
LAB_001b0a41:
    pcStack_370 = (code *)0x1b0a4e;
    run_test_pipe_overlong_path_cold_6();
LAB_001b0a4e:
    pcStack_370 = (code *)0x1b0a5b;
    run_test_pipe_overlong_path_cold_7();
  }
  pcStack_370 = (code *)0x1b0a68;
  run_test_pipe_overlong_path_cold_8();
LAB_001b0a68:
  iVar1 = (int)&local_360;
  pcStack_370 = connect_overlong_cb;
  run_test_pipe_overlong_path_cold_9();
  pcStack_370 = (code *)(long)iVar1;
  if (pcStack_370 == (code *)0xffffffffffffffea) {
    connect_cb_called = connect_cb_called + 1;
    iVar1 = uv_close(*(undefined8 *)((long)plVar3 + 0x50),close_cb);
    return iVar1;
  }
  ppcVar4 = &pcStack_370;
  connect_overlong_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(ppcVar4,0);
  return iVar1;
}

Assistant:

TEST_IMPL(pipe_overlong_path) {
  uv_pipe_t pipe;
  uv_connect_t req;

  ASSERT_OK(uv_pipe_init(uv_default_loop(), &pipe, 0));

#ifndef _WIN32
  char path[512];
  memset(path, '@', sizeof(path));
  ASSERT_EQ(UV_ENAMETOOLONG,
            uv_pipe_bind2(&pipe, path, sizeof(path), UV_PIPE_NO_TRUNCATE));
  ASSERT_EQ(UV_ENAMETOOLONG,
            uv_pipe_connect2(&req,
                             &pipe,
                             path,
                             sizeof(path),
                             UV_PIPE_NO_TRUNCATE,
                             (uv_connect_cb) abort));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
#endif

  ASSERT_EQ(UV_EINVAL, uv_pipe_bind(&pipe, ""));
  uv_pipe_connect(&req,
                  &pipe,
                  "",
                  (uv_connect_cb) connect_overlong_cb);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;

}